

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int flatcc_builder_start_string(flatcc_builder_t *B)

{
  int iVar1;
  
  iVar1 = enter_frame(B,1);
  if (iVar1 == 0) {
    (B->frame->container).table.vs_end = 1;
    (B->frame->container).table.pl_end = 0;
    B->frame->type = 6;
    refresh_ds(B,0xfffffffc);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int flatcc_builder_start_string(flatcc_builder_t *B)
{
    if (enter_frame(B, 1)) {
        return -1;
    }
    frame(container.vector.elem_size) = 1;
    frame(container.vector.count) = 0;
    frame(type) = flatcc_builder_string;
    refresh_ds(B, data_limit);
    return 0;
}